

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  char *__s;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  ostringstream e;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  bVar2 = cmFSPermissions::stringToModeT(arg,permissions);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    __s = this->Name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(_func_int *)
                           ((long)local_1b8 + (long)*(_func_int **)(local_198._0_8_ + -0x18)) + 0x20
                     );
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198," given invalid permission \"",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(arg->_M_dataplus)._M_p,arg->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
    pcVar1 = this->Status;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return bVar2;
}

Assistant:

bool cmFileCopier::CheckPermissions(std::string const& arg,
                                    mode_t& permissions)
{
  if (!cmFSPermissions::stringToModeT(arg, permissions)) {
    std::ostringstream e;
    e << this->Name << " given invalid permission \"" << arg << "\".";
    this->Status.SetError(e.str());
    return false;
  }
  return true;
}